

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

double __thiscall ON_MorphControl::Weight(ON_MorphControl *this,ON_3dex ijk)

{
  int iVar1;
  int k;
  int i;
  double dVar2;
  
  k = ijk.k;
  iVar1 = this->m_varient;
  i = ijk.i;
  if (iVar1 == 3) {
    dVar2 = ON_NurbsCage::Weight(&this->m_nurbs_cage,i,ijk.j,k);
    return dVar2;
  }
  if (iVar1 == 2) {
    if (k == 0) {
      dVar2 = ON_NurbsSurface::Weight(&this->m_nurbs_surface,i,ijk.j);
      return dVar2;
    }
  }
  else if ((iVar1 == 1) && (k == 0 && ijk._0_8_ >> 0x20 == 0)) {
    dVar2 = ON_NurbsCurve::Weight(&this->m_nurbs_curve,i);
    return dVar2;
  }
  return 1.0;
}

Assistant:

double ON_MorphControl::Weight(ON_3dex ijk) const
{
  double w = 1.0;

  switch(m_varient)
  {
  case 1:
    w = (0 == ijk.j && 0 == ijk.k) ? m_nurbs_curve.Weight(ijk.i) : 1.0;
    break;
  case 2:
    w = (0 == ijk.k) ? m_nurbs_surface.Weight(ijk.i,ijk.j) : 1.0;
    break;
  case 3:
    w = m_nurbs_cage.Weight(ijk.i,ijk.j,ijk.k);
    break;
  }

  return w;
}